

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

void golf_json_object_set_data(JSON_Object *obj,char *name,uchar *data,int data_len)

{
  uchar *string;
  uchar *enc_data;
  int enc_len;
  int data_len_local;
  uchar *data_local;
  char *name_local;
  JSON_Object *obj_local;
  
  enc_data._4_4_ = data_len;
  _enc_len = data;
  data_local = (uchar *)name;
  name_local = (char *)obj;
  string = golf_base64_encode(data,data_len,(int *)&enc_data);
  if (string == (uchar *)0x0) {
    golf_log_warning("Failed to encode data in field %s",data_local);
  }
  json_object_set_string((JSON_Object *)name_local,(char *)data_local,(char *)string);
  golf_free_tracked(string);
  return;
}

Assistant:

void golf_json_object_set_data(JSON_Object *obj, const char *name, unsigned char *data, int data_len) {
    int enc_len;
    unsigned char *enc_data = golf_base64_encode(data, data_len, &enc_len);
    if (!enc_data) {
        golf_log_warning("Failed to encode data in field %s", name);
    }
    json_object_set_string(obj, name, (char*)enc_data);
    golf_free(enc_data);
}